

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# string.c
# Opt level: O1

char * strarray_get(strarray *array,size_t idx)

{
  size_t sVar1;
  char *__s;
  long lVar2;
  char *pcVar3;
  
  __s = array->value;
  if ((__s != (char *)0x0) && (pcVar3 = __s + array->length, __s < pcVar3)) {
    lVar2 = idx + 1;
    do {
      lVar2 = lVar2 + -1;
      if (lVar2 == 0) {
        return __s;
      }
      sVar1 = strlen(__s);
      __s = __s + sVar1 + 1;
    } while (__s < pcVar3);
  }
  return (char *)0x0;
}

Assistant:

char *
strarray_get(const struct strarray *array, size_t idx) {
  size_t count = 0;
  char *ptr;

  strarray_for_each_element(array, ptr) {
    if (count == idx) {
      return ptr;
    }
    count++;
  }
  return NULL;
}